

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm_decode_ioctl.c
# Opt level: O0

void decode_nvrm_ioctl_vspace_map(nvrm_ioctl_vspace_map *s)

{
  char *pcVar1;
  FILE *__stream;
  int iVar2;
  char *pcVar3;
  nvrm_ioctl_vspace_map *s_local;
  
  if ((s->cid != 0) || (iVar2 = _nvrm_field_enabled("cid"), iVar2 != 0)) {
    fprintf(_stdout,"%scid: 0x%08x",nvrm_pfx,(ulong)s->cid);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
    if ((s->handle != 0) || (iVar2 = _nvrm_field_enabled("handle"), iVar2 != 0)) {
      fprintf(_stdout,"%shandle: 0x%08x",nvrm_pfx,(ulong)s->handle);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->handle,"handle");
  }
  if ((s->dev != 0) || (iVar2 = _nvrm_field_enabled("dev"), iVar2 != 0)) {
    if ((s->dev != 0) || (iVar2 = _nvrm_field_enabled("dev"), iVar2 != 0)) {
      fprintf(_stdout,"%sdev: 0x%08x",nvrm_pfx,(ulong)s->dev);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->dev,"dev");
  }
  if ((s->vspace != 0) || (iVar2 = _nvrm_field_enabled("vspace"), iVar2 != 0)) {
    if ((s->vspace != 0) || (iVar2 = _nvrm_field_enabled("vspace"), iVar2 != 0)) {
      fprintf(_stdout,"%svspace: 0x%08x",nvrm_pfx,(ulong)s->vspace);
    }
    nvrm_pfx = nvrm_sep;
    describe_nvrm_object(s->cid,s->vspace,"vspace");
  }
  if ((s->base != 0) || (iVar2 = _nvrm_field_enabled("base"), iVar2 != 0)) {
    fprintf(_stdout,"%sbase: 0x%016lx",nvrm_pfx,s->base);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->size != 0) || (iVar2 = _nvrm_field_enabled("size"), iVar2 != 0)) {
    fprintf(_stdout,"%ssize: 0x%016lx",nvrm_pfx,s->size);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->flags != 0) || (iVar2 = _nvrm_field_enabled("flags"), iVar2 != 0)) {
    fprintf(_stdout,"%sflags: 0x%08x",nvrm_pfx,(ulong)s->flags);
  }
  nvrm_pfx = nvrm_sep;
  if (s->_pad1 != 0) {
    fprintf(_stdout,"%s%s_pad1: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad1,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->addr != 0) || (iVar2 = _nvrm_field_enabled("addr"), iVar2 != 0)) {
    fprintf(_stdout,"%saddr: 0x%016lx",nvrm_pfx,s->addr);
  }
  nvrm_pfx = nvrm_sep;
  if ((s->status != 0) || (iVar2 = _nvrm_field_enabled("status"), iVar2 != 0)) {
    __stream = _stdout;
    pcVar1 = nvrm_pfx;
    pcVar3 = nvrm_status(s->status);
    fprintf(__stream,"%sstatus: %s",pcVar1,pcVar3);
  }
  nvrm_pfx = nvrm_sep;
  if (s->_pad2 != 0) {
    fprintf(_stdout,"%s%s_pad2: 0x%08x%s",nvrm_sep,colors->err,(ulong)s->_pad2,colors->reset);
  }
  nvrm_pfx = nvrm_sep;
  fprintf(_stdout,"\n");
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
  }
  return;
}

Assistant:

static void decode_nvrm_ioctl_vspace_map(struct nvrm_ioctl_vspace_map *s)
{
	nvrm_print_cid(s, cid);
	nvrm_print_handle(s, handle, cid);
	nvrm_print_handle(s, dev, cid);
	nvrm_print_handle(s, vspace, cid);
	nvrm_print_x64(s, base);
	nvrm_print_x64(s, size);
	nvrm_print_x32(s, flags);
	nvrm_print_pad_x32(s, _pad1);
	nvrm_print_x64(s, addr);
	nvrm_print_status(s, status);
	nvrm_print_pad_x32(s, _pad2);
	nvrm_print_ln();
}